

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

uint8_t * openMerkleTree(tree_t *tree,uint16_t *missingLeaves,size_t missingLeavesSize,
                        size_t *outputSizeBytes)

{
  uint *__ptr;
  size_t *in_RCX;
  size_t *in_RDX;
  size_t in_RSI;
  uint16_t *in_RDI;
  size_t i;
  uint8_t *outputBase;
  uint8_t *output;
  uint *revealed;
  size_t revealedSize;
  tree_t *in_stack_fffffffffffffff8;
  uint8_t *puVar1;
  
  __ptr = getRevealedMerkleNodes(in_stack_fffffffffffffff8,in_RDI,in_RSI,in_RDX);
  if (__ptr == (uint *)0x0) {
    puVar1 = (uint8_t *)0x0;
  }
  else {
    *in_RCX = 0;
    puVar1 = (uint8_t *)malloc(*in_RCX);
    if (puVar1 == (uint8_t *)0x0) {
      free(__ptr);
      puVar1 = (uint8_t *)0x0;
    }
    else {
      free(__ptr);
    }
  }
  return puVar1;
}

Assistant:

uint8_t* openMerkleTree(tree_t* tree, uint16_t* missingLeaves, size_t missingLeavesSize,
                        size_t* outputSizeBytes) {
  size_t revealedSize = 0;
  unsigned int* revealed =
      getRevealedMerkleNodes(tree, missingLeaves, missingLeavesSize, &revealedSize);
  if (!revealed) {
    return NULL;
  }

  /* Serialize output */
  *outputSizeBytes = revealedSize * tree->dataSize;
  uint8_t* output  = malloc(*outputSizeBytes);
  if (!output) {
    free(revealed);
    return NULL;
  }

  uint8_t* outputBase = output;
  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(output, &tree->nodes[revealed[i] * tree->dataSize], tree->dataSize);
    output += tree->dataSize;
  }

  free(revealed);
  return outputBase;
}